

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O3

void __thiscall cmComputeComponentGraph::TransferEdges(cmComputeComponentGraph *this)

{
  pointer *ppcVar1;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_00;
  int iVar2;
  pointer pcVar3;
  iterator __position;
  cmGraphEdge cVar4;
  uint uVar5;
  pointer pcVar6;
  ulong uVar7;
  pointer pcVar8;
  cmGraphEdge local_38;
  
  uVar5 = (int)((long)(this->InputGraph->
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->InputGraph->
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x55555555;
  if (0 < (int)uVar5) {
    uVar7 = 0;
    do {
      pcVar3 = (this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar8 = *(pointer *)&pcVar3[uVar7].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      pcVar6 = *(pointer *)((long)(pcVar3 + uVar7) + 8);
      if (pcVar8 != pcVar6) {
        iVar2 = (this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        do {
          local_38.Dest =
               (this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[pcVar8->Dest];
          if (iVar2 != local_38.Dest) {
            this_00 = &(this->ComponentGraph).
                       super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                       super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl
                       .super__Vector_impl_data._M_start[iVar2].
                       super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
            local_38.Strong = pcVar8->Strong;
            __position._M_current =
                 (this_00->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this_00->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::_M_realloc_insert<cmGraphEdge>
                        (this_00,__position,&local_38);
            }
            else {
              cVar4.Strong = pcVar8->Strong;
              cVar4._5_3_ = local_38._5_3_;
              cVar4.Dest = local_38.Dest;
              *__position._M_current = cVar4;
              ppcVar1 = &(this_00->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppcVar1 = *ppcVar1 + 1;
            }
            pcVar6 = *(pointer *)((long)(pcVar3 + uVar7) + 8);
          }
          pcVar8 = pcVar8 + 1;
        } while (pcVar8 != pcVar6);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uVar5 & 0x7fffffff));
  }
  return;
}

Assistant:

void cmComputeComponentGraph::TransferEdges()
{
  // Map inter-component edges in the original graph to edges in the
  // component graph.
  int n = static_cast<int>(this->InputGraph.size());
  for (int i = 0; i < n; ++i) {
    int i_component = this->TarjanComponents[i];
    EdgeList const& nl = this->InputGraph[i];
    for (EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni) {
      int j = *ni;
      int j_component = this->TarjanComponents[j];
      if (i_component != j_component) {
        // We do not attempt to combine duplicate edges, but instead
        // store the inter-component edges with suitable multiplicity.
        this->ComponentGraph[i_component].push_back(
          cmGraphEdge(j_component, ni->IsStrong()));
      }
    }
  }
}